

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_facade.cpp
# Opt level: O1

void __thiscall Clasp::ClaspFacade::~ClaspFacade(ClaspFacade *this)

{
  ulong uVar1;
  pointer pLVar2;
  long *plVar3;
  
  (this->super_ModelHandler)._vptr_ModelHandler = (_func_int **)&PTR__ClaspFacade_001e8188;
  SingleOwnerPtr<Clasp::ClaspFacade::SolveData,_Clasp::DeleteObject>::reset
            (&this->solve_,(SolveData *)0x0);
  SingleOwnerPtr<Clasp::ClaspFacade::Statistics,_Clasp::DeleteObject>::reset
            (&this->stats_,(Statistics *)0x0);
  SingleOwnerPtr<Clasp::ClaspFacade::Summary,_Clasp::DeleteObject>::reset
            (&this->accu_,(Summary *)0x0);
  uVar1 = (this->builder_).ptr_;
  plVar3 = (long *)(uVar1 & 0xfffffffffffffffe);
  if ((uVar1 & 1) != 0 && plVar3 != (long *)0x0) {
    (this->builder_).ptr_ = (uintp)plVar3;
    (**(code **)(*plVar3 + 8))();
  }
  (this->builder_).ptr_ = 1;
  pLVar2 = (this->assume_).ebo_.buf;
  if (pLVar2 != (pointer)0x0) {
    operator_delete(pLVar2);
  }
  SharedContext::~SharedContext(&this->ctx);
  ModelHandler::~ModelHandler(&this->super_ModelHandler);
  return;
}

Assistant:

ClaspFacade::~ClaspFacade() {}